

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring_checked.hh
# Opt level: O2

uint64_t __thiscall doublechecked::Roaring::and_cardinality(Roaring *this,Roaring *r)

{
  _Rb_tree_color _Var1;
  uint64_t uVar2;
  long lVar3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  int line;
  uint64_t count;
  uint64_t uVar6;
  char *expression;
  unsigned_long result;
  _Rb_tree_header *p_Var7;
  _Rb_tree_header *p_Var8;
  
  uVar2 = roaring::Roaring::and_cardinality(&this->plain,&r->plain);
  p_Var4 = (this->check)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var8 = &(this->check)._M_t._M_impl.super__Rb_tree_header;
  p_Var5 = (r->check)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var7 = &(r->check)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var5 == p_Var7 || (_Rb_tree_header *)p_Var4 == p_Var8) {
    result = (unsigned_long)(uVar2 == 0);
    expression = "ans == 0";
    line = 0x192;
  }
  else {
    _Var1 = p_Var4[1]._M_color;
    lVar3 = std::_Rb_tree_decrement(&p_Var7->_M_header);
    if (_Var1 <= *(_Rb_tree_color *)(lVar3 + 0x20)) {
      _Var1 = p_Var5[1]._M_color;
      lVar3 = std::_Rb_tree_decrement(&p_Var8->_M_header);
      if (_Var1 <= *(_Rb_tree_color *)(lVar3 + 0x20)) {
        uVar6 = 0;
LAB_00105e46:
        do {
          if (((_Rb_tree_header *)p_Var4 == p_Var8) || ((_Rb_tree_header *)p_Var5 == p_Var7))
          goto LAB_00105e85;
          if (p_Var4[1]._M_color == p_Var5[1]._M_color) {
            uVar6 = uVar6 + 1;
            p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
          }
          else if (p_Var4[1]._M_color < p_Var5[1]._M_color) {
            p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
            goto LAB_00105e46;
          }
          p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
        } while( true );
      }
    }
    result = (unsigned_long)(uVar2 == 0);
    expression = "ans == 0";
    line = 0x194;
  }
LAB_00105ea1:
  _assert_true(result,expression,
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring_checked.hh"
               ,line);
  return uVar2;
LAB_00105e85:
  result = (unsigned_long)(uVar2 == uVar6);
  expression = "ans == count";
  line = 0x1a3;
  goto LAB_00105ea1;
}

Assistant:

uint64_t and_cardinality(const Roaring &r) const {
        uint64_t ans = plain.and_cardinality(r.plain);

        auto it = check.begin();
        auto it_end = check.end();
        auto r_it = r.check.begin();
        auto r_it_end = r.check.end();
        if (it == it_end || r_it == r_it_end) {
            assert_true(ans == 0);  // if either is empty then no intersection
        } else if (*it > *r.check.rbegin() || *r_it > *check.rbegin()) {
            assert_true(ans == 0);  // obvious disjoint
        } else {                    // may overlap
            uint64_t count = 0;
            while (it != it_end && r_it != r_it_end) {
                if (*it == *r_it) {
                    ++count;
                    ++it;
                    ++r_it;
                }  // count overlap
                else if (*it < *r_it) {
                    ++it;
                } else {
                    ++r_it;
                }
            }
            assert_true(ans == count);
        }

        return ans;
    }